

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O0

void __thiscall
Assembler::relocationTableEntry::relocationTableEntry
          (relocationTableEntry *this,int offset,string *typeOfRelocation,int value,string *section)

{
  string *section_local;
  int value_local;
  string *typeOfRelocation_local;
  int offset_local;
  relocationTableEntry *this_local;
  
  std::__cxx11::string::string((string *)&this->typeOfRelocation);
  std::__cxx11::string::string((string *)&this->section);
  this->offset = offset;
  std::__cxx11::string::operator=((string *)&this->typeOfRelocation,(string *)typeOfRelocation);
  this->value = value;
  std::__cxx11::string::operator=((string *)&this->section,(string *)section);
  return;
}

Assistant:

relocationTableEntry(int offset = 0, string typeOfRelocation = "", int value = -1, string section = "") {

            this->offset = offset;
            this->typeOfRelocation = typeOfRelocation;
            this->value = value;
            this->section = section;
        }